

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall kj::anon_unknown_36::WebSocketImpl::abort(WebSocketImpl *this)

{
  Maybe<kj::(anonymous_namespace)::WebSocketImpl::ControlMessage>::operator=
            (&this->queuedControlMessage);
  Maybe<kj::Promise<void>_>::operator=(&this->sendingControlMessage);
  this->disconnected = true;
  (*(((this->stream).ptr)->super_AsyncInputStream)._vptr_AsyncInputStream[7])();
  (*(((this->stream).ptr)->super_AsyncInputStream)._vptr_AsyncInputStream[6])();
  return;
}

Assistant:

void abort() override {
    queuedControlMessage = kj::none;
    sendingControlMessage = kj::none;
    disconnected = true;
    stream->abortRead();
    stream->shutdownWrite();
  }